

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.h
# Opt level: O0

void __thiscall wasm::IRBuilder::IRBuilder(IRBuilder *this,Module *wasm)

{
  Module *wasm_local;
  IRBuilder *this_local;
  
  this->wasm = wasm;
  this->func = (Function *)0x0;
  Builder::Builder(&this->builder,wasm);
  this->binaryPos = (size_t *)0x0;
  this->lastBinaryPos = 0;
  this->codeSectionOffset = 0;
  std::
  variant<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  ::variant(&this->debugLoc);
  std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::vector
            (&this->scopeStack);
  std::
  unordered_map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::unordered_map(&this->labelDepths);
  this->blockHint = 0;
  this->labelHint = 0;
  return;
}

Assistant:

IRBuilder(Module& wasm) : wasm(wasm), builder(wasm) {}